

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Node * __thiscall Graph::getNode(Graph *this,int idx)

{
  ostream *poVar1;
  Node **node;
  pointer ppNVar2;
  
  ppNVar2 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppNVar2 ==
        (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Node ",5);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,idx);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"does not exist\n",0xf);
      return (Node *)0x0;
    }
    if ((*ppNVar2)->index == idx) break;
    ppNVar2 = ppNVar2 + 1;
  }
  return *ppNVar2;
}

Assistant:

Node* Graph::getNode(int idx) {
    // TODO: Look for a way to sort by index to compute faster this operation
    for(auto&node:adj_list)
        if(node->index == idx)
            return node;
    std::cerr<<"Node "<< idx << "does not exist\n";
    return nullptr;
}